

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::CommentTemplateToken::CommentTemplateToken
          (CommentTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,string *t)

{
  TemplateToken::TemplateToken(&this->super_TemplateToken,Comment,loc,pre,post);
  (this->super_TemplateToken)._vptr_TemplateToken =
       (_func_int **)&PTR__CommentTemplateToken_0022b8e8;
  std::__cxx11::string::string((string *)&this->text,(string *)t);
  return;
}

Assistant:

CommentTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string& t) : TemplateToken(Type::Comment, loc, pre, post), text(t) {}